

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseQRequiresClauseExpr(State *state)

{
  long lVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  State *in_RDI;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffe4;
  char one_char_token;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  one_char_token = (char)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar4 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar4) {
    local_1 = false;
  }
  else {
    iVar2 = (in_RDI->parse_state).mangled_idx;
    iVar3 = (in_RDI->parse_state).out_cur_idx;
    lVar1 = *(long *)&(in_RDI->parse_state).prev_name_idx;
    DisableAppend(in_RDI);
    bVar4 = ParseOneCharToken(in_stack_ffffffffffffffe8.state_,one_char_token);
    if ((bVar4) && (bVar4 = ParseExpression(in_stack_00000078), bVar4)) {
      RestoreAppend(in_RDI,lVar1 < 0);
      local_1 = true;
    }
    else {
      (in_RDI->parse_state).mangled_idx = iVar2;
      (in_RDI->parse_state).out_cur_idx = iVar3;
      *(long *)&(in_RDI->parse_state).prev_name_idx = lVar1;
      local_1 = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseQRequiresClauseExpr(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  DisableAppend(state);

  // <requires-clause expr> is just an <expression>: http://shortn/_9E1Ul0rIM8
  if (ParseOneCharToken(state, 'Q') && ParseExpression(state)) {
    RestoreAppend(state, copy.append);
    return true;
  }

  // also restores append
  state->parse_state = copy;
  return false;
}